

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckCOSDerivedOK
              (xmlSchemaAbstractCtxtPtr actxt,xmlSchemaTypePtr type,xmlSchemaTypePtr baseType,
              int set)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaTypeLinkPtr pxVar3;
  
  if ((type->type != XML_SCHEMA_TYPE_SIMPLE) &&
     ((type->type != XML_SCHEMA_TYPE_BASIC || (type->builtInType == 0x2d)))) {
    iVar1 = 0;
    if (type != baseType) {
      while ((((set & 2U) == 0 || ((type->flags & 2) == 0)) &&
             (((set & 1U) == 0 || ((type->flags & 4) == 0))))) {
        type = type->baseType;
        if (type == baseType) {
          return 0;
        }
        if (type->type != XML_SCHEMA_TYPE_COMPLEX) {
          if (type->type == XML_SCHEMA_TYPE_BASIC) {
            if (type->builtInType == 0x2d) {
              return 1;
            }
            goto code_r0x001a45eb;
          }
          if (type->builtInType != 0x2d) {
            iVar1 = xmlSchemaCheckCOSSTDerivedOK(actxt,type,baseType,set);
            return iVar1;
          }
        }
      }
      iVar1 = 1;
    }
    return iVar1;
  }
code_r0x001a45eb:
  if (type != baseType) {
    if ((((type->type != XML_SCHEMA_TYPE_BASIC) && ((type->flags & 0x400000) == 0)) &&
        (iVar1 = xmlSchemaTypeFixup(type,actxt), iVar1 == -1)) ||
       (((baseType->type != XML_SCHEMA_TYPE_BASIC && ((baseType->flags & 0x400000) == 0)) &&
        (iVar1 = xmlSchemaTypeFixup(baseType,actxt), iVar1 == -1)))) {
      return -1;
    }
    if ((set & 1U) != 0) {
      return 0xbd7;
    }
    pxVar2 = type->baseType;
    if ((pxVar2 != (xmlSchemaTypePtr)0x0) && ((pxVar2->flags & 0x400) != 0)) {
      return 0xbd7;
    }
    if (((pxVar2 != baseType) &&
        (((pxVar2->type == XML_SCHEMA_TYPE_BASIC && (pxVar2->builtInType == 0x2d)) ||
         (iVar1 = xmlSchemaCheckCOSSTDerivedOK(actxt,pxVar2,baseType,set), iVar1 != 0)))) &&
       (((baseType->type != XML_SCHEMA_TYPE_BASIC || (baseType->builtInType != 0x2e)) ||
        ((type->flags & 0xc0) == 0)))) {
      if ((baseType->flags & 0x80) == 0) {
        return 0xbd8;
      }
      pxVar3 = (xmlSchemaTypeLinkPtr)&baseType->memberTypes;
      do {
        pxVar3 = pxVar3->next;
        if (pxVar3 == (xmlSchemaTypeLinkPtr)0x0) {
          return 0xbd8;
        }
        pxVar2 = pxVar3->type;
        if ((pxVar2->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar2->flags & 0x400000) == 0)) {
          iVar1 = xmlSchemaTypeFixup(pxVar2,actxt);
          if (iVar1 == -1) {
            return -1;
          }
          pxVar2 = pxVar3->type;
        }
        iVar1 = xmlSchemaCheckCOSSTDerivedOK(actxt,type,pxVar2,set);
      } while (iVar1 != 0);
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaCheckCOSDerivedOK(xmlSchemaAbstractCtxtPtr actxt,
			   xmlSchemaTypePtr type,
			   xmlSchemaTypePtr baseType,
			   int set)
{
    if (WXS_IS_SIMPLE(type))
	return (xmlSchemaCheckCOSSTDerivedOK(actxt, type, baseType, set));
    else
	return (xmlSchemaCheckCOSCTDerivedOK(actxt, type, baseType, set));
}